

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

UBool __thiscall icu_63::UVector::operator==(UVector *this,UVector *other)

{
  UBool UVar1;
  UBool UVar2;
  long lVar3;
  
  if (this->count == other->count) {
    UVar2 = '\x01';
    if (0 < this->count && this->comparer != (UElementsAreEqual *)0x0) {
      lVar3 = 0;
      do {
        UVar1 = (*this->comparer)((UElement)this->elements[lVar3].pointer,
                                  (UElement)other->elements[lVar3].pointer);
        if (UVar1 == '\0') goto LAB_003836d2;
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->count);
    }
  }
  else {
LAB_003836d2:
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UBool UVector::operator==(const UVector& other) {
    int32_t i;
    if (count != other.count) return FALSE;
    if (comparer != NULL) {
        // Compare using this object's comparer
        for (i=0; i<count; ++i) {
            if (!(*comparer)(elements[i], other.elements[i])) {
                return FALSE;
            }
        }
    }
    return TRUE;
}